

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O0

bool edge_detection::DetectHorizontalEdge<double>(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  size_type sVar4;
  pointer pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  const_iterator point_1;
  const_iterator point;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *negative;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *positive;
  EdgeDetectionBase<double> edgeDetection;
  bool isValidRightEdge;
  bool isValidLeftEdge;
  uint32_t roiXEnd;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image image;
  uint32_t i;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint32_t in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe94;
  uint8_t in_stack_fffffffffffffe96;
  uint8_t in_stack_fffffffffffffe97;
  uint32_t in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  EdgeDetectionBase<double> *in_stack_fffffffffffffeb0;
  bool local_11d;
  bool local_111;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_f8;
  PointBase2D<double> *local_f0;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_e8;
  EdgeDetectionBase<double> *local_e0;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_d8;
  EdgeParameter local_d0;
  EdgeDetectionBase<double> local_b0;
  int local_80;
  bool local_7a;
  bool local_79;
  int local_78;
  uint local_74;
  int local_70;
  uint local_68;
  ImageTemplate<unsigned_char> local_30;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar3 = local_8, uVar2 = Test_Helper::runCount(), uVar3 < uVar2;
      local_8 = local_8 + 1) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe97,in_stack_fffffffffffffe96);
    Unit_Test::blackImage((Image *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1867f0);
    Unit_Test::generateRoi
              (in_stack_fffffffffffffea0,
               (uint32_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (uint32_t *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))),
               (uint32_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (uint32_t *)0x18681d);
    local_78 = local_68 + local_70;
    local_111 = false;
    if (1 < local_68) {
      uVar3 = local_68 + 1;
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
      local_111 = uVar3 < uVar2;
    }
    local_79 = local_111;
    local_11d = false;
    if (local_68 != 0) {
      uVar3 = local_78 + 2;
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
      local_11d = uVar3 < uVar2;
    }
    local_7a = local_11d;
    if (((local_79 & 1U) == 0) && (local_11d == false)) {
      local_80 = 4;
    }
    else {
      Test_Helper::randomValue<unsigned_char>(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90);
      Unit_Test::fillImage
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                 CONCAT13(in_stack_fffffffffffffe97,
                          CONCAT12(in_stack_fffffffffffffe96,in_stack_fffffffffffffe94)),
                 in_stack_fffffffffffffe90,(uint8_t)((uint)in_stack_fffffffffffffe8c >> 0x18));
      EdgeDetectionBase<double>::EdgeDetectionBase
                ((EdgeDetectionBase<double> *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
      in_stack_fffffffffffffe98 = 10;
      in_stack_fffffffffffffe90 = 0;
      in_stack_fffffffffffffe88 = 0;
      EdgeParameter::EdgeParameter(&local_d0,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
      EdgeDetectionBase<double>::find
                (in_stack_fffffffffffffeb0,
                 (Image *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (EdgeParameter *)in_stack_fffffffffffffea0);
      local_d8 = EdgeDetectionBase<double>::positiveEdge(&local_b0);
      in_stack_fffffffffffffeb0 =
           (EdgeDetectionBase<double> *)EdgeDetectionBase<double>::negativeEdge(&local_b0);
      local_e0 = in_stack_fffffffffffffeb0;
      if ((((local_79 & 1U) == 0) ||
          (sVar4 = std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::size
                             (local_d8), sVar4 == local_74)) &&
         (((local_7a & 1U) == 0 ||
          (sVar4 = std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::size
                             (&local_e0->positiveEdgePoint), sVar4 == local_74)))) {
        local_e8._M_current =
             (PointBase2D<double> *)
             std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
                       ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        while( true ) {
          local_f0 = (PointBase2D<double> *)
                     std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                               ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT24(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90))),
                             (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          auVar8 = in_ZMM1._0_16_;
          if (!bVar1) break;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                   ::operator->(&local_e8);
          auVar8 = vcvtusi2sd_avx512f(auVar8,local_68);
          auVar9._8_8_ = 0x7fffffffffffffff;
          auVar9._0_8_ = 0x7fffffffffffffff;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pPVar5->x - auVar8._0_8_;
          auVar8 = vpand_avx(auVar6,auVar9);
          in_ZMM1 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          if (1.0 < auVar8._0_8_) {
            local_1 = 0;
            local_80 = 1;
            goto LAB_00186c1e;
          }
          __gnu_cxx::
          __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
          ::operator++(&local_e8);
        }
        local_f8._M_current =
             (PointBase2D<double> *)
             std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
                       ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        while( true ) {
          std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                    ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT24(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90))),
                             (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          auVar8 = in_ZMM1._0_16_;
          if (!bVar1) break;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                   ::operator->(&local_f8);
          auVar8 = vcvtusi2sd_avx512f(auVar8,local_78);
          auVar10._8_8_ = 0x7fffffffffffffff;
          auVar10._0_8_ = 0x7fffffffffffffff;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pPVar5->x - auVar8._0_8_;
          auVar8 = vpand_avx(auVar7,auVar10);
          in_ZMM1 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          if (1.0 < auVar8._0_8_) {
            local_1 = 0;
            local_80 = 1;
            goto LAB_00186c1e;
          }
          __gnu_cxx::
          __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
          ::operator++(&local_f8);
        }
        local_80 = 0;
      }
      else {
        local_1 = 0;
        local_80 = 1;
      }
LAB_00186c1e:
      EdgeDetectionBase<double>::~EdgeDetectionBase
                ((EdgeDetectionBase<double> *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x186c38);
    if ((local_80 != 0) && (local_80 == 1)) goto LAB_00186c85;
    in_stack_fffffffffffffeac = local_80;
  }
  local_1 = 1;
LAB_00186c85:
  return (bool)(local_1 & 1);
}

Assistant:

bool DetectHorizontalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiXEnd = roiX + roiWidth;
            const bool isValidLeftEdge  = ( roiX > 1u ) && ( roiX    + 1u < image.width() );
            const bool isValidRightEdge = ( roiX > 0u ) && ( roiXEnd + 2u < image.width() );

            if ( !isValidLeftEdge && !isValidRightEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::LEFT_TO_RIGHT) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidLeftEdge && (positive.size() != roiHeight) ) || ( isValidRightEdge && (negative.size() != roiHeight) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->x - roiX ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->x - roiXEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }